

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

void __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
skipWhitespaceAndComments
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this)

{
  bool bVar1;
  UnicodeChar UVar2;
  CompileMessage local_78;
  UTF8Reader local_40;
  UTF8Reader local_38;
  UTF8Reader local_30;
  UTF8Reader local_28;
  UnicodeChar local_1c;
  UnicodeChar c2;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *local_10;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *this_local;
  
  local_10 = this;
  while( true ) {
    while( true ) {
      UTF8Reader::findEndOfWhitespace((UTF8Reader *)&stack0xffffffffffffffe8);
      UTF8Reader::operator=(&this->input,(UTF8Reader *)&stack0xffffffffffffffe8);
      UVar2 = UTF8Reader::operator*(&this->input);
      if (UVar2 != 0x2f) {
        return;
      }
      UTF8Reader::operator+(&local_28,(int)this + 0x68);
      local_1c = UTF8Reader::operator*(&local_28);
      if (local_1c != 0x2f) break;
      UTF8Reader::find(&local_30,(char *)&this->input);
      UTF8Reader::operator=(&this->input,&local_30);
    }
    if (local_1c != 0x2a) break;
    UTF8Reader::operator=(&(this->location).location,&this->input);
    UTF8Reader::operator+(&local_40,(int)this + 0x68);
    UTF8Reader::find(&local_38,(char *)&local_40);
    UTF8Reader::operator=(&this->input,&local_38);
    bVar1 = UTF8Reader::isEmpty(&this->input);
    if (bVar1) {
      Errors::unterminatedComment<>();
      (*this->_vptr_Tokeniser[2])(this,&local_78);
      CompileMessage::~CompileMessage(&local_78);
    }
    UTF8Reader::operator+=(&this->input,2);
  }
  return;
}

Assistant:

void skipWhitespaceAndComments()
    {
        for (;;)
        {
            input = input.findEndOfWhitespace();

            if (*input == '/')
            {
                auto c2 = *(input + 1);

                if (c2 == '/')  { input = input.find ("\n"); continue; }

                if (c2 == '*')
                {
                    location.location = input;
                    input = (input + 2).find ("*/");
                    if (input.isEmpty()) throwError (Errors::unterminatedComment());
                    input += 2; continue;
                }
            }

            break;
        }
    }